

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O1

uint32_t __thiscall rcg::Buffer::getNumberOfParts(Buffer *this)

{
  PDSGetNumBufferParts p_Var1;
  GC_ERROR GVar2;
  void *pvVar3;
  uint32_t ret;
  unsigned_long ret_1;
  size_t size;
  INFO_DATATYPE type;
  uint32_t local_2c;
  long local_28 [2];
  INFO_DATATYPE local_14;
  
  local_2c = 0;
  if (this->multipart == true) {
    p_Var1 = ((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->DSGetNumBufferParts;
    pvVar3 = Stream::getHandle(this->parent);
    (*p_Var1)(pvVar3,this->buffer,&local_2c);
  }
  else {
    pvVar3 = Stream::getHandle(this->parent);
    local_28[0] = 0;
    local_28[1] = 8;
    if (this->buffer != (BUFFER_HANDLE)0x0 && pvVar3 != (void *)0x0) {
      GVar2 = (*((this->gentl).
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                DSGetBufferInfo)(pvVar3,this->buffer,0x13,&local_14,local_28,
                                 (size_t *)(local_28 + 1));
      if (GVar2 != 0) {
        local_28[0] = 0;
      }
    }
    if (local_28[0] != 8) {
      local_2c = 1;
    }
  }
  return local_2c;
}

Assistant:

uint32_t Buffer::getNumberOfParts() const
{
  uint32_t ret=0;

  if (multipart)
  {
    gentl->DSGetNumBufferParts(parent->getHandle(), buffer, &ret);
  }
  else
  {
    size_t type=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                       GenTL::BUFFER_INFO_PAYLOADTYPE);

    if (type != PAYLOAD_TYPE_CHUNK_ONLY)
    {
      ret=1;
    }
  }

  return ret;
}